

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

xmlRelaxNGParserCtxtPtr xmlRelaxNGNewParserCtxt(char *URL)

{
  xmlRelaxNGParserCtxtPtr __s;
  xmlChar *pxVar1;
  
  if (URL == (char *)0x0) {
    __s = (xmlRelaxNGParserCtxtPtr)0x0;
  }
  else {
    __s = (xmlRelaxNGParserCtxtPtr)(*xmlMalloc)(0x110);
    if (__s == (xmlRelaxNGParserCtxtPtr)0x0) {
      __s = (xmlRelaxNGParserCtxtPtr)0x0;
      xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0x12,
                          (xmlError *)0x0);
    }
    else {
      memset(__s,0,0x110);
      pxVar1 = xmlStrdup((xmlChar *)URL);
      __s->URL = pxVar1;
    }
  }
  return __s;
}

Assistant:

xmlRelaxNGParserCtxtPtr
xmlRelaxNGNewParserCtxt(const char *URL)
{
    xmlRelaxNGParserCtxtPtr ret;

    if (URL == NULL)
        return (NULL);

    ret =
        (xmlRelaxNGParserCtxtPtr) xmlMalloc(sizeof(xmlRelaxNGParserCtxt));
    if (ret == NULL) {
        xmlRngPErrMemory(NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlRelaxNGParserCtxt));
    ret->URL = xmlStrdup((const xmlChar *) URL);
    return (ret);
}